

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

error_or<unsigned_long> * __thiscall
pstore::romfs::open_file::seek
          (error_or<unsigned_long> *__return_storage_ptr__,open_file *this,off_t offset,
          seek_mode whence)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t local_68;
  uoff_type positive_offset;
  size_t file_size;
  size_t new_pos;
  anon_class_1_0_00000001 make_error;
  size_t sStack_20;
  seek_mode whence_local;
  off_t offset_local;
  open_file *this_local;
  
  file_size = 0;
  new_pos._4_4_ = whence;
  sStack_20 = offset;
  iVar2 = dirent::stat(this->dir_,(char *)this,(stat *)offset);
  if (new_pos._4_4_ == set) {
    if ((long)sStack_20 < 0) {
      seek::anon_class_1_0_00000001::operator()
                (__return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&new_pos + 3),einval);
      return __return_storage_ptr__;
    }
    file_size = sStack_20;
  }
  else if (new_pos._4_4_ == cur) {
    if ((long)sStack_20 < 0) {
      if (this->pos_ < -sStack_20) {
        seek::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&new_pos + 3),einval);
        return __return_storage_ptr__;
      }
      sVar1 = this->pos_;
    }
    else {
      sVar1 = this->pos_;
    }
    file_size = sVar1 + sStack_20;
  }
  else if (new_pos._4_4_ == end) {
    if (((long)sStack_20 < 0) && (*(ulong *)CONCAT44(extraout_var,iVar2) < -sStack_20)) {
      seek::anon_class_1_0_00000001::operator()
                (__return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&new_pos + 3),einval);
      return __return_storage_ptr__;
    }
    local_68 = *(ulong *)CONCAT44(extraout_var,iVar2) + sStack_20;
    file_size = local_68;
  }
  this->pos_ = file_size;
  error_or<unsigned_long>::error_or<unsigned_long&,void>(__return_storage_ptr__,&file_size);
  return __return_storage_ptr__;
}

Assistant:

error_or<std::size_t> open_file::seek (off_t const offset, seek_mode const whence) {
            auto make_error = [] (error_code const erc) {
                return error_or<std::size_t> (make_error_code (erc));
            };
            using uoff_type = std::make_unsigned<off_t>::type;
            std::size_t new_pos = 0;
            std::size_t const file_size = dir_.stat ().size;
            switch (whence) {
            case seek_mode::set:
                if (offset < 0) {
                    return make_error (error_code::einval);
                }
                new_pos = static_cast<uoff_type> (offset);
                break;
            case seek_mode::cur:
                if (offset < 0) {
                    auto const positive_offset = static_cast<uoff_type> (-offset);
                    if (positive_offset > pos_) {
                        return make_error (error_code::einval);
                    }
                    new_pos = pos_ - positive_offset;
                } else {
                    new_pos = pos_ + static_cast<uoff_type> (offset);
                }
                break;
            case seek_mode::end:
                if (offset < 0 && static_cast<std::size_t> (-offset) > file_size) {
                    return make_error (error_code::einval);
                }
                new_pos = (offset >= 0) ? (file_size + static_cast<uoff_type> (offset))
                                        : (file_size - static_cast<uoff_type> (-offset));
                break;
            }

            pos_ = new_pos;
            return error_or<std::size_t>{new_pos};
        }